

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

size_t next_pow2(size_t x)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  if (1 < x) {
    uVar3 = x - 1;
    if (x == 0) {
      uVar3 = uVar2;
    }
    do {
      uVar2 = uVar2 + 1;
      bVar1 = 1 < uVar3;
      uVar3 = uVar3 >> 1;
    } while (bVar1);
  }
  return 1L << ((byte)uVar2 & 0x3f);
}

Assistant:

size_t next_pow2(size_t x)
{
  int i = 0;
  x = x > 0 ? x - 1 : 0;
  while (x > 0)
  {
    x >>= 1;
    i++;
  }
  return ((size_t)1) << i;
}